

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkInsertNewLogic(Abc_Ntk_t *pNtkH,Abc_Ntk_t *pNtkL)

{
  void *pvVar1;
  long *plVar2;
  Abc_Des_t *pAVar3;
  void **ppvVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  char *pcVar11;
  uint uVar12;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  long lVar15;
  
  if (pNtkH->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2ba,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkH->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkH) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,699,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkH->nObjCounts[10] < 1) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkH) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,700,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2be,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2bf,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2c0,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtkL);
  pNtk = Abc_NtkAlloc(pNtkL->ntkType,pNtkL->ntkFunc,1);
  pcVar6 = Extra_UtilStrsav(pNtkH->pName);
  pNtk->pName = pcVar6;
  pcVar6 = Extra_UtilStrsav(pNtkH->pSpec);
  pNtk->pSpec = pcVar6;
  pVVar10 = pNtkH->vPis;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      pAVar8 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar10->pArray[lVar15] + 0x20) + 8) +
                (long)**(int **)((long)pVVar10->pArray[lVar15] + 0x30) * 8);
      pcVar6 = Abc_ObjName(pAVar8);
      pAVar7 = Abc_NtkFindNet(pNtkL,pcVar6);
      if ((pAVar7 == (Abc_Obj_t *)0x0) ||
         ((*(uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] + 0x14) & 0xf) !=
          2)) {
        pcVar6 = Abc_ObjName(pAVar8);
        pcVar11 = "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n";
        goto LAB_0085453d;
      }
      pvVar1 = (pAVar7->field_6).pTemp;
      pcVar6 = Abc_ObjName(pAVar8);
      if (pvVar1 != (void *)0x0) {
        pcVar11 = "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n";
        goto LAB_0085453d;
      }
      pAVar8 = Abc_NtkFindOrCreateNet(pNtk,pcVar6);
      (pAVar7->field_6).pCopy = pAVar8;
      Abc_NtkDupObj(pNtk,(Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray],0);
      lVar15 = lVar15 + 1;
      pVVar10 = pNtkH->vPis;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = pNtkH->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar10->pArray[lVar15];
      if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 10) {
        Abc_NtkDupBox(pNtk,pAVar8,0);
        ((pAVar8->field_6).pCopy)->field_5 = pAVar8->field_5;
        if (0 < (pAVar8->vFanouts).nSize) {
          lVar14 = 0;
          do {
            plVar2 = (long *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanouts).pArray[lVar14]];
            pAVar7 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
            pcVar6 = Abc_ObjName(pAVar7);
            pAVar9 = Abc_NtkFindNet(pNtkL,pcVar6);
            if ((pAVar9 == (Abc_Obj_t *)0x0) ||
               ((*(uint *)((long)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray] + 0x14) &
                0xf) != 2)) {
              pcVar6 = Abc_ObjName(pAVar7);
              pcVar11 = Abc_ObjName(pAVar8);
              printf("Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n"
                     ,pcVar6,pcVar11);
              goto LAB_0085454a;
            }
            pvVar1 = (pAVar9->field_6).pTemp;
            pcVar6 = Abc_ObjName(pAVar7);
            if (pvVar1 != (void *)0x0) {
              printf("Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n",pcVar6);
              goto LAB_0085454a;
            }
            pAVar7 = Abc_NtkFindOrCreateNet(pNtk,pcVar6);
            (pAVar9->field_6).pCopy = pAVar7;
            *(long *)((long)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray] + 0x40) =
                 plVar2[8];
            lVar14 = lVar14 + 1;
          } while (lVar14 < (pAVar8->vFanouts).nSize);
        }
      }
      lVar15 = lVar15 + 1;
      pVVar10 = pNtkH->vBoxes;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar13 = pNtkH->vPos;
  if (0 < pVVar13->nSize) {
    lVar15 = 0;
LAB_0085419d:
    pAVar8 = *(Abc_Obj_t **)
              (*(long *)(*(long *)(*pVVar13->pArray[lVar15] + 0x20) + 8) +
              (long)**(int **)((long)pVVar13->pArray[lVar15] + 0x20) * 8);
    pcVar6 = Abc_ObjName(pAVar8);
    pAVar7 = Abc_NtkFindNet(pNtkL,pcVar6);
    if ((pAVar7 != (Abc_Obj_t *)0x0) &&
       ((*(uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray] + 0x14) & 0xf) == 3
       )) goto code_r0x008541ff;
    pcVar6 = Abc_ObjName(pAVar8);
    pcVar11 = "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n";
LAB_0085453d:
    printf(pcVar11,pcVar6);
    goto LAB_0085454a;
  }
LAB_00854256:
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar10->pArray[lVar15];
      if (((*(uint *)&pAVar8->field_0x14 & 0xf) == 10) && (0 < (pAVar8->vFanins).nSize)) {
        lVar14 = 0;
        do {
          plVar2 = (long *)pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar14]];
          pAVar7 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
          Abc_ObjName(pAVar7);
          pcVar6 = Abc_ObjName(pAVar7);
          pAVar9 = Abc_NtkFindNet(pNtkL,pcVar6);
          if ((pAVar9 == (Abc_Obj_t *)0x0) ||
             (pvVar1 = pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanouts).pArray],
             (*(uint *)((long)pvVar1 + 0x14) & 0xf) != 3)) {
            pcVar6 = Abc_ObjName(pAVar7);
            pcVar11 = Abc_ObjName(pAVar8);
            printf("There is no PO corresponding to the input %s of blackbox %s.\n",pcVar6,pcVar11);
            goto LAB_0085454a;
          }
          if ((pAVar9->field_6).pCopy == (Abc_Obj_t *)0x0) {
            pcVar6 = Abc_ObjName(pAVar7);
            pAVar7 = Abc_NtkFindOrCreateNet(pNtk,pcVar6);
            (pAVar9->field_6).pCopy = pAVar7;
            *(long *)((long)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanouts).pArray] + 0x40) =
                 plVar2[8];
          }
          else if (*(long *)((long)pvVar1 + 0x40) == 0) {
            *(Abc_Obj_t **)((long)pvVar1 + 0x40) = (Abc_Obj_t *)plVar2[8];
          }
          else {
            Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],(pAVar9->field_6).pCopy);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pAVar8->vFanins).nSize);
        pVVar10 = pNtkH->vBoxes;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = pNtkL->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar10->pArray[lVar15];
      if (((pAVar8 != (Abc_Obj_t *)0x0) && ((pAVar8->field_6).pTemp == (void *)0x0)) &&
         (uVar12 = *(uint *)&pAVar8->field_0x14 & 0xf, uVar12 != 3)) {
        Abc_NtkDupObj(pNtk,pAVar8,(uint)(uVar12 == 6));
        pVVar10 = pNtkL->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar10->nSize);
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        plVar2 = (long *)pVVar10->pArray[lVar15];
        if ((plVar2 != (long *)0x0) && (iVar5 = *(int *)((long)plVar2 + 0x1c), 0 < iVar5)) {
          lVar14 = 0;
          do {
            if ((Abc_Obj_t *)plVar2[8] != (Abc_Obj_t *)0x0) {
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)(plVar2[4] + lVar14 * 4) * 8) + 0x40));
              iVar5 = *(int *)((long)plVar2 + 0x1c);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < iVar5);
          pVVar10 = pNtkL->vObjs;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar10->nSize);
    }
  }
  pAVar3 = pNtkH->pDesign;
  pNtkH->pDesign = (Abc_Des_t *)0x0;
  pVVar10 = pAVar3->vModules;
  if (pVVar10->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar4 = pVVar10->pArray;
  if ((Abc_Ntk_t *)*ppvVar4 != pNtkH) {
    __assert_fail("Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x337,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  *ppvVar4 = pNtk;
  pNtk->pDesign = pAVar3;
  iVar5 = Abc_NtkCheck(pNtk);
  if (iVar5 == 0) {
    fwrite("Abc_NtkInsertNewLogic(): Network check has failed.\n",0x33,1,_stdout);
LAB_0085454a:
    Abc_NtkDelete(pNtk);
    pNtk = (Abc_Ntk_t *)0x0;
  }
  return pNtk;
code_r0x008541ff:
  if ((pAVar7->field_6).pTemp == (void *)0x0) {
    pcVar6 = Abc_ObjName(pAVar8);
    pAVar8 = Abc_NtkFindOrCreateNet(pNtk,pcVar6);
    (pAVar7->field_6).pCopy = pAVar8;
    Abc_NtkDupObj(pNtk,(Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray],0);
  }
  lVar15 = lVar15 + 1;
  pVVar13 = pNtkH->vPos;
  if (pVVar13->nSize <= lVar15) goto code_r0x00854252;
  goto LAB_0085419d;
code_r0x00854252:
  pVVar10 = pNtkH->vBoxes;
  goto LAB_00854256;
}

Assistant:

Abc_Ntk_t * Abc_NtkInsertNewLogic( Abc_Ntk_t * pNtkH, Abc_Ntk_t * pNtkL )
{
    Abc_Des_t * pDesign;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjH, * pObjL, * pNetH, * pNetL, * pTermH;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtkH) );
    assert( Abc_NtkWhiteboxNum(pNtkH) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkH) > 0 );

    assert( Abc_NtkIsNetlist(pNtkL) );
    assert( Abc_NtkWhiteboxNum(pNtkL) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkL) == 0 );

    // prepare the logic network for copying
    Abc_NtkCleanCopy( pNtkL );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtkL->ntkType, pNtkL->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtkH->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtkH->pSpec );

    // make sure every PI/PO has a PI/PO in the processed network
    Abc_NtkForEachPi( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanout0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanin0(pNetL), 0 );
    }

    // make sure every BB has a PI/PO in the processed network
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        // duplicate the box 
        Abc_NtkDupBox( pNtkNew, pObjH, 0 );
        pObjH->pCopy->pData = pObjH->pData;
        // create PIs
        Abc_ObjForEachFanout( pObjH, pTermH, k )
        {
            pNetH = Abc_ObjFanout0( pTermH );
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            if ( pNetL->pCopy )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n", Abc_ObjName(pNetH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PI
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanin0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    Abc_NtkForEachPo( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanin0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
            continue;
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanout0(pNetL), 0 );
    }
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        Abc_ObjForEachFanin( pObjH, pTermH, k )
        {
            char * pName;
            pNetH = Abc_ObjFanin0( pTermH );
            pName = Abc_ObjName(pNetH);
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
            {
                printf( "There is no PO corresponding to the input %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PO
            if ( pNetL->pCopy )
            {
                if ( Abc_ObjFanout0(pNetL)->pCopy == NULL )
                    Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
                else
                    Abc_ObjAddFanin( pTermH->pCopy, pNetL->pCopy );
                continue;
            }
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    // duplicate other objects of the logic network
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        if ( pObjL->pCopy == NULL && !Abc_ObjIsPo(pObjL) ) // skip POs feeding into PIs
            Abc_NtkDupObj( pNtkNew, pObjL, Abc_ObjIsNet(pObjL) );

    // connect objects
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        Abc_ObjForEachFanin( pObjL, pNetL, k )
            if ( pObjL->pCopy )
                Abc_ObjAddFanin( pObjL->pCopy, pNetL->pCopy );

    // transfer the design
    pDesign = pNtkH->pDesign;  pNtkH->pDesign = NULL;
    assert( Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH );
    Vec_PtrWriteEntry( pDesign->vModules, 0, pNtkNew );
    pNtkNew->pDesign = pDesign;

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkInsertNewLogic(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}